

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[8]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[8]>_>_>,_const_ezy::to_string_fn_&>
          *range,basic_string_view<char,_std::char_traits<char>_> *separator)

{
  to_string_fn *ptVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  iterator_adaptor<ezy::detail::take_iterator<const_int[8]>,_const_ezy::to_string_fn_&> __first;
  iterator_adaptor<ezy::detail::take_iterator<const_int[8]>,_const_ezy::to_string_fn_&> __last;
  anon_class_24_2_e8cc7173 __f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  iterator_tracker_for<const_int[8]> in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffa0;
  
  if (*(long *)(this + 8) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    to_string_fn::operator()(__return_storage_ptr__,*(to_string_fn **)(this + 0x10),*(int **)this);
    ptVar1 = (to_string_fn *)(range->orig_range).t.range.t;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (range->orig_range).t.n;
    __first.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.n =
         (size_type)ptVar1;
    __first.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.tracker.
    iters.super__Tuple_impl<0UL,_const_int_*>.super__Head_base<0UL,_const_int_*,_false>._M_head_impl
         = (tuple<const_int_*>)(tuple<const_int_*>)__return_storage_ptr__;
    __first.converter = (to_string_fn *)pbVar2;
    __last.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.n =
         (size_type)__return_storage_ptr__;
    __last.super_basic_iterator_adaptor<ezy::detail::take_iterator<const_int[8]>_>.orig.tracker.
    iters.super__Tuple_impl<0UL,_const_int_*>.super__Head_base<0UL,_const_int_*,_false>._M_head_impl
         = in_stack_ffffffffffffff80.iters.super__Tuple_impl<0UL,_const_int_*>.
           super__Head_base<0UL,_const_int_*,_false>._M_head_impl;
    __last.converter = ptVar1;
    __f.separator = in_stack_ffffffffffffffa0;
    __f.result = pbVar2;
    std::
    for_each<ezy::detail::iterator_adaptor<ezy::detail::take_iterator<int_const[8]>,ezy::to_string_fn_const&>,ezy::join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[8]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>(ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[8]>>>,ezy::to_string_fn_const&>&&,std::basic_string_view<char,std::char_traits<char>>&)::_lambda(auto:1_const&)_1_>
              ((anon_class_24_2_e8cc7173 *)&stack0xffffffffffffffa0,__first,__last,__f);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }